

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnd_timedwait.c
# Opt level: O2

int cnd_timedwait(cnd_t *cond,mtx_t *mtx,timespec *ts)

{
  int iVar1;
  int iVar2;
  
  iVar1 = pthread_cond_timedwait((pthread_cond_t *)cond,(pthread_mutex_t *)mtx,(timespec *)ts);
  iVar2 = 1;
  if (iVar1 != 0) {
    iVar2 = (uint)(iVar1 != 0x6e) * 3;
  }
  return iVar2;
}

Assistant:

int cnd_timedwait( cnd_t * _PDCLIB_restrict cond, mtx_t * _PDCLIB_restrict mtx, const struct timespec * _PDCLIB_restrict ts )
{
    switch ( pthread_cond_timedwait( cond, mtx, ts ) )
    {
        case 0:
            return thrd_success;

        case ETIMEDOUT:
            return thrd_timedout;

        default:
            return thrd_error;
    }
}